

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O2

void __thiscall StringTest::Test10(StringTest *this)

{
  int iVar1;
  allocator<char> local_49;
  string t1;
  string t2;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t1,"This is y a sentence with vowels.",(allocator<char> *)&t2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t2,"aeiou",&local_49);
  iVar1 = std::__cxx11::string::find_first_of((string *)&t1,(ulong)&t2);
  if (iVar1 != 2) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x276,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((string *)&t1,(ulong)&t2);
  if (iVar1 != 2) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x27b,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((string *)&t1,(ulong)&t2);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x280,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((char *)&t1,0x10899f);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x285,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((char *)&t1,0x1089dc,6);
  if (iVar1 != 10) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x28a,"Failed to find third vowel");
  }
  iVar1 = std::__cxx11::string::find((char)&t1,0x79);
  if (iVar1 != 8) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x28f,"Failed to find \'y\'");
  }
  iVar1 = std::__cxx11::string::find((char)&t1,0x73);
  if (iVar1 != 0xc) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x294,"Failed to find \'s\'");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  return;
}

Assistant:

void Test10()
	{
		// find_first_of
		string t1 = "This is y a sentence with vowels.";
		string t2 = "aeiou";
		
		unsigned i = t1.find_first_of( t2 );
		
		if ( i != 2 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_first_of( t2, 2 );

		if ( i != 2 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_first_of( t2, 3 );

		if ( i != 5 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_first_of( "aeiou", 3 );

		if ( i != 5 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_first_of( "aeiouy", 6, 5 );

		if ( i != 10 )
			TestFailed( "Failed to find third vowel" );

		i = t1.find_first_of( 'y' );

		if ( i != 8 )
			TestFailed( "Failed to find \'y\'" );

		i = t1.find_first_of( 's', 8 );

		if ( i != 12 )
			TestFailed( "Failed to find \'s\'" );
		
		TestPassed();
	}